

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

void Aig_ManMarkValidChoices(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  int local_24;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                  ,0x1e5,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
  }
  if (p->pEquivs == (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar2 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    p->pEquivs = ppAVar2;
    ppAVar2 = p->pEquivs;
    iVar1 = Aig_ManObjNumMax(p);
    memset(ppAVar2,0,(long)iVar1 << 3);
    local_24 = 0;
    do {
      iVar1 = Vec_PtrSize(p->vObjs);
      if (iVar1 <= local_24) {
        return;
      }
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
      if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
         (pObj_01 = Aig_ObjFindRepr(p,pObj_00), pObj_01 != (Aig_Obj_t *)0x0)) {
        iVar1 = Aig_ObjIsNode(pObj_01);
        if (iVar1 == 0) {
          Aig_ObjClearRepr(p,pObj_00);
        }
        else {
          iVar1 = Aig_ObjCheckTfi(p,pObj_00,pObj_01);
          if (iVar1 == 0) {
            if ((*(ulong *)&pObj_00->field_0x18 >> 6 & 0x3ffffff) == 0) {
              if ((*(ulong *)&pObj_00->field_0x18 >> 6 & 0x3ffffff) != 0) {
                __assert_fail("pObj->nRefs == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                              ,0x203,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
              }
              p->pEquivs[pObj_00->Id] = p->pEquivs[pObj_01->Id];
              p->pEquivs[pObj_01->Id] = pObj_00;
            }
            else {
              Aig_ObjClearRepr(p,pObj_00);
            }
          }
          else {
            Aig_ObjClearRepr(p,pObj_00);
          }
        }
      }
      local_24 = local_24 + 1;
    } while( true );
  }
  __assert_fail("p->pEquivs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                ,0x1e7,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
}

Assistant:

void Aig_ManMarkValidChoices( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i;
    assert( p->pReprs != NULL );
    // create equivalent nodes in the manager
    assert( p->pEquivs == NULL );
    p->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    memset( p->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    // make the choice nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindRepr( p, pObj );
        if ( pRepr == NULL )
            continue;
        // skip constant and PI classes
        if ( !Aig_ObjIsNode(pRepr) )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
        // skip choices with combinatinal loops
        if ( Aig_ObjCheckTfi( p, pObj, pRepr ) )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
//printf( "Node %d is represented by node %d.\n", pObj->Id, pRepr->Id );
        // add choice to the choice node
        if ( pObj->nRefs > 0 )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
        assert( pObj->nRefs == 0 );
        p->pEquivs[pObj->Id] = p->pEquivs[pRepr->Id];
        p->pEquivs[pRepr->Id] = pObj;
    }
}